

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smallft.c
# Opt level: O0

void drft_init(drft_lookup *l,int n)

{
  float *pfVar1;
  int *piVar2;
  int n_local;
  drft_lookup *l_local;
  
  l->n = n;
  pfVar1 = (float *)calloc((long)(n * 3),4);
  l->trigcache = pfVar1;
  piVar2 = (int *)calloc(0x20,4);
  l->splitcache = piVar2;
  fdrffti(n,l->trigcache,l->splitcache);
  return;
}

Assistant:

void drft_init(drft_lookup *l,int n){
  l->n=n;
  l->trigcache=_ogg_calloc(3*n,sizeof(*l->trigcache));
  l->splitcache=_ogg_calloc(32,sizeof(*l->splitcache));
  fdrffti(n, l->trigcache, l->splitcache);
}